

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qringbuffer.cpp
# Opt level: O3

char * __thiscall QRingBuffer::reserve(QRingBuffer *this,qint64 bytes)

{
  int iVar1;
  iterator iVar2;
  Data *pDVar3;
  long lVar4;
  QRingChunk *pQVar5;
  qint64 alloc;
  long in_FS_OFFSET;
  QRingChunk local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->basicBlockSize;
  alloc = bytes;
  if (bytes < iVar1) {
    alloc = (long)iVar1;
  }
  if (this->bufferSize == 0) {
    if ((this->buffers).d.size == 0) goto LAB_0012712a;
    iVar2 = QList<QRingChunk>::begin(&this->buffers);
    QRingChunk::allocate(iVar2.i,alloc);
LAB_0012717e:
    lVar4 = 0;
  }
  else {
    if (iVar1 == 0) {
LAB_0012712a:
      QByteArray::QByteArray(&local_50.chunk,alloc,Uninitialized);
      local_50.headOffset = 0;
      local_50.tailOffset = 0;
      QtPrivate::QMovableArrayOps<QRingChunk>::emplace<QRingChunk>
                ((QMovableArrayOps<QRingChunk> *)this,(this->buffers).d.size,&local_50);
      QList<QRingChunk>::end(&this->buffers);
      if (&(local_50.chunk.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_50.chunk.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_50.chunk.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0012717e;
    }
    lVar4 = (this->buffers).d.size;
    pQVar5 = (this->buffers).d.ptr;
    pDVar3 = pQVar5[lVar4 + -1].chunk.d.d;
    if (((pDVar3 == (Data *)0x0) ||
        ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)) ||
       (pQVar5[lVar4 + -1].chunk.d.size - pQVar5[lVar4 + -1].tailOffset < bytes)) goto LAB_0012712a;
    lVar4 = pQVar5[lVar4 + -1].tailOffset - pQVar5[lVar4 + -1].headOffset;
  }
  iVar2 = QList<QRingChunk>::end(&this->buffers);
  iVar2.i[-1].tailOffset = iVar2.i[-1].tailOffset + bytes;
  this->bufferSize = this->bufferSize + bytes;
  iVar2 = QList<QRingChunk>::end(&this->buffers);
  pDVar3 = iVar2.i[-1].chunk.d.d;
  pQVar5 = iVar2.i + -1;
  if ((pDVar3 == (Data *)0x0) ||
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> != 1)) {
    QRingChunk::detach(pQVar5);
    pDVar3 = (pQVar5->chunk).d.d;
    if (pDVar3 != (Data *)0x0) goto LAB_001271c3;
  }
  else {
LAB_001271c3:
    if ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)
    goto LAB_001271db;
  }
  QByteArray::reallocData(&pQVar5->chunk,iVar2.i[-1].chunk.d.size,KeepSize);
LAB_001271db:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2.i[-1].chunk.d.ptr + lVar4 + iVar2.i[-1].headOffset;
  }
  __stack_chk_fail();
}

Assistant:

char *QRingBuffer::reserve(qint64 bytes)
{
    Q_ASSERT(bytes > 0 && bytes < QByteArray::maxSize());

    const qsizetype chunkSize = qMax(qint64(basicBlockSize), bytes);
    qsizetype tail = 0;
    if (bufferSize == 0) {
        if (buffers.isEmpty())
            buffers.append(QRingChunk(chunkSize));
        else
            buffers.first().allocate(chunkSize);
    } else {
        const QRingChunk &chunk = buffers.constLast();
        // if need a new buffer
        if (basicBlockSize == 0 || chunk.isShared() || bytes > chunk.available())
            buffers.append(QRingChunk(chunkSize));
        else
            tail = chunk.size();
    }

    buffers.last().grow(bytes);
    bufferSize += bytes;
    return buffers.last().data() + tail;
}